

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void readvalue(uint8 *base,uint32 typeoffset,uint32 valoffset,MOJOSHADER_effectValue *value,
              MOJOSHADER_effectObject *objects,MOJOSHADER_malloc m,void *d)

{
  int iVar1;
  int iVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 typeoffset_00;
  uint32 valoffset_00;
  uint uVar5;
  char *pcVar6;
  void *pvVar7;
  uint *puVar8;
  undefined8 *puVar9;
  int local_c0;
  int local_bc;
  int src_offset;
  int dst_offset;
  uint32 memsize;
  uint32 memname;
  MOJOSHADER_symbolStructMember *mem;
  uint32 structsize;
  uint32 siz_3;
  uint32 siz_2;
  uint32 numobjects;
  uint32 statevaloffset;
  uint32 statetypeoffset;
  uint32 stype;
  MOJOSHADER_effectSamplerState *state;
  uint32 siz_1;
  uint32 numstates;
  uint vallen;
  uint32 siz;
  uint32 rowcount;
  uint32 columncount;
  uint32 numelements;
  uint32 semantic;
  uint32 name;
  uint32 valclass;
  uint32 type;
  uint typelen;
  uint8 *valptr;
  uint8 *typeptr;
  uint local_38;
  int k;
  int j;
  int i;
  MOJOSHADER_malloc m_local;
  MOJOSHADER_effectObject *objects_local;
  MOJOSHADER_effectValue *value_local;
  uint32 valoffset_local;
  uint32 typeoffset_local;
  uint8 *base_local;
  
  valptr = base + typeoffset;
  _type = base + valoffset;
  valclass = 9999999;
  _j = m;
  m_local = (MOJOSHADER_malloc)objects;
  objects_local = (MOJOSHADER_effectObject *)value;
  value_local._0_4_ = valoffset;
  value_local._4_4_ = typeoffset;
  _valoffset_local = base;
  name = readui32(&valptr,&valclass);
  semantic = readui32(&valptr,&valclass);
  numelements = readui32(&valptr,&valclass);
  columncount = readui32(&valptr,&valclass);
  rowcount = readui32(&valptr,&valclass);
  *(uint32 *)((long)objects_local + 0x14) = name;
  *(uint32 *)((long)objects_local + 0x10) = semantic;
  pcVar6 = readstring(_valoffset_local,numelements,_j,d);
  *(char **)objects_local = pcVar6;
  pcVar6 = readstring(_valoffset_local,columncount,_j,d);
  *(char **)((long)objects_local + 8) = pcVar6;
  *(uint32 *)((long)objects_local + 0x20) = rowcount;
  if (5 < semantic) {
    __assert_fail("valclass >= MOJOSHADER_SYMCLASS_SCALAR && valclass <= MOJOSHADER_SYMCLASS_STRUCT"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                  ,0x10f,
                  "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                 );
  }
  if ((((semantic == 0) || (semantic == 1)) || (semantic == 2)) || (semantic == 3)) {
    if ((name == 0) || (3 < name)) {
      __assert_fail("type >= MOJOSHADER_SYMTYPE_BOOL && type <= MOJOSHADER_SYMTYPE_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x117,
                    "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                   );
    }
    siz = readui32(&valptr,&valclass);
    vallen = readui32(&valptr,&valclass);
    *(uint32 *)((long)objects_local + 0x1c) = siz;
    *(uint *)((long)objects_local + 0x18) = vallen;
    numstates = vallen * 4;
    if (rowcount != 0) {
      numstates = rowcount * numstates;
    }
    *(uint32 *)((long)objects_local + 0x30) = numstates;
    numstates = numstates << 2;
    pvVar7 = (*_j)(numstates,d);
    *(void **)((long)objects_local + 0x38) = pvVar7;
    memset(*(void **)((long)objects_local + 0x38),0,(ulong)numstates);
    numstates = numstates >> 4;
    for (k = 0; (uint)k < numstates; k = k + 1) {
      memcpy((void *)(*(long *)((long)objects_local + 0x38) + (long)(k << 2) * 4),
             _type + siz * 4 * k,(ulong)(siz << 2));
    }
  }
  else if (semantic == 4) {
    if ((name < 4) || (0x10 < name)) {
      __assert_fail("type >= MOJOSHADER_SYMTYPE_STRING && type <= MOJOSHADER_SYMTYPE_VERTEXSHADER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x12d,
                    "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                   );
    }
    if ((((name == 10) || (name == 0xb)) || (name == 0xc)) || ((name == 0xd || (name == 0xe)))) {
      siz_1 = 9999999;
      uVar3 = readui32((uint8 **)&type,&siz_1);
      *(uint32 *)((long)objects_local + 0x30) = uVar3;
      pvVar7 = (*_j)(uVar3 * 0x48,d);
      *(void **)((long)objects_local + 0x38) = pvVar7;
      memset(*(void **)((long)objects_local + 0x38),0,(ulong)(uVar3 * 0x48));
      for (k = 0; (uint)k < uVar3; k = k + 1) {
        puVar8 = (uint *)(*(long *)((long)objects_local + 0x38) + (long)k * 0x48);
        uVar4 = readui32((uint8 **)&type,&siz_1);
        readui32((uint8 **)&type,&siz_1);
        typeoffset_00 = readui32((uint8 **)&type,&siz_1);
        valoffset_00 = readui32((uint8 **)&type,&siz_1);
        *puVar8 = uVar4 & 0xffffff5f;
        readvalue(_valoffset_local,typeoffset_00,valoffset_00,(MOJOSHADER_effectValue *)(puVar8 + 2)
                  ,(MOJOSHADER_effectObject *)m_local,_j,d);
        if ((uVar4 & 0xffffff5f) == 4) {
          *(uint32 *)(m_local + (long)**(int **)(puVar8 + 0x10) * 0x48) = name;
        }
      }
    }
    else {
      siz_3 = 1;
      if (rowcount != 0) {
        siz_3 = rowcount;
      }
      *(uint32 *)((long)objects_local + 0x30) = siz_3;
      pvVar7 = (*_j)(siz_3 << 2,d);
      *(void **)((long)objects_local + 0x38) = pvVar7;
      memcpy(*(void **)((long)objects_local + 0x38),_type,(ulong)(siz_3 << 2));
      for (k = 0; (uint)k < *(uint *)((long)objects_local + 0x30); k = k + 1) {
        *(uint32 *)
         (m_local + (long)*(int *)(*(long *)((long)objects_local + 0x38) + (long)k * 4) * 0x48) =
             name;
      }
    }
  }
  else if (semantic == 5) {
    uVar3 = readui32(&valptr,&valclass);
    *(uint32 *)((long)objects_local + 0x24) = uVar3;
    pvVar7 = (*_j)(*(int *)((long)objects_local + 0x24) * 0x28,d);
    *(void **)((long)objects_local + 0x28) = pvVar7;
    mem._4_4_ = 0;
    for (k = 0; (uint)k < *(uint *)((long)objects_local + 0x24); k = k + 1) {
      puVar9 = (undefined8 *)(*(long *)((long)objects_local + 0x28) + (long)k * 0x28);
      uVar3 = readui32(&valptr,&valclass);
      *(uint32 *)((long)puVar9 + 0xc) = uVar3;
      uVar3 = readui32(&valptr,&valclass);
      *(uint32 *)(puVar9 + 1) = uVar3;
      uVar3 = readui32(&valptr,&valclass);
      readui32(&valptr,&valclass);
      pcVar6 = readstring(_valoffset_local,uVar3,_j,d);
      *puVar9 = pcVar6;
      uVar3 = readui32(&valptr,&valclass);
      *(uint32 *)(puVar9 + 3) = uVar3;
      uVar3 = readui32(&valptr,&valclass);
      *(uint32 *)((long)puVar9 + 0x14) = uVar3;
      uVar3 = readui32(&valptr,&valclass);
      *(uint32 *)(puVar9 + 2) = uVar3;
      if (1 < *(uint *)(puVar9 + 1)) {
        __assert_fail("mem->info.parameter_class >= MOJOSHADER_SYMCLASS_SCALAR && mem->info.parameter_class <= MOJOSHADER_SYMCLASS_VECTOR"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x178,
                      "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                     );
      }
      if ((*(int *)((long)puVar9 + 0xc) == 0) || (3 < *(uint *)((long)puVar9 + 0xc))) {
        __assert_fail("mem->info.parameter_type >= MOJOSHADER_SYMTYPE_BOOL && mem->info.parameter_type <= MOJOSHADER_SYMTYPE_FLOAT"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x17a,
                      "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                     );
      }
      *(undefined4 *)((long)puVar9 + 0x1c) = 0;
      puVar9[4] = 0;
      src_offset = *(int *)(puVar9 + 2) * 4;
      if (*(int *)(puVar9 + 3) != 0) {
        src_offset = *(int *)(puVar9 + 3) * src_offset;
      }
      mem._4_4_ = src_offset + mem._4_4_;
    }
    *(int *)((long)objects_local + 0x1c) = mem._4_4_;
    *(undefined4 *)((long)objects_local + 0x18) = 1;
    *(int *)((long)objects_local + 0x30) = mem._4_4_;
    if (rowcount != 0) {
      *(uint32 *)((long)objects_local + 0x30) = rowcount * *(int *)((long)objects_local + 0x30);
    }
    uVar5 = *(int *)((long)objects_local + 0x30) << 2;
    pvVar7 = (*_j)(uVar5,d);
    *(void **)((long)objects_local + 0x38) = pvVar7;
    memset(*(void **)((long)objects_local + 0x38),0,(ulong)uVar5);
    local_bc = 0;
    local_c0 = 0;
    k = 0;
    do {
      for (local_38 = 0; local_38 < *(uint *)((long)objects_local + 0x24); local_38 = local_38 + 1)
      {
        iVar1 = *(int *)(*(long *)((long)objects_local + 0x28) + (long)(int)local_38 * 0x28 + 0x10);
        iVar2 = *(int *)(*(long *)((long)objects_local + 0x28) + (long)(int)local_38 * 0x28 + 0x18);
        for (typeptr._4_4_ = 0; typeptr._4_4_ < (uint)(iVar1 * iVar2);
            typeptr._4_4_ = typeptr._4_4_ + 1) {
          memcpy((void *)(*(long *)((long)objects_local + 0x38) + (long)local_bc * 4),
                 valptr + local_c0,
                 (ulong)(uint)(*(int *)(*(long *)((long)objects_local + 0x28) +
                                        (long)(int)local_38 * 0x28 + 0x14) << 2));
          local_bc = local_bc + 4;
          local_c0 = *(int *)(*(long *)((long)objects_local + 0x28) + (long)(int)local_38 * 0x28 +
                             0x14) * 4 + local_c0;
        }
      }
      k = k + 1;
    } while ((uint)k < rowcount);
  }
  return;
}

Assistant:

static void readvalue(const uint8 *base,
                      const uint32 typeoffset,
                      const uint32 valoffset,
                      MOJOSHADER_effectValue *value,
                      MOJOSHADER_effectObject *objects,
                      MOJOSHADER_malloc m,
                      void *d)
{
    int i, j, k;
    const uint8 *typeptr = base + typeoffset;
    const uint8 *valptr = base + valoffset;
    unsigned int typelen = 9999999;  // !!! FIXME
    const uint32 type = readui32(&typeptr, &typelen);
    const uint32 valclass = readui32(&typeptr, &typelen);
    const uint32 name = readui32(&typeptr, &typelen);
    const uint32 semantic = readui32(&typeptr, &typelen);
    const uint32 numelements = readui32(&typeptr, &typelen);

    value->type.parameter_type = (MOJOSHADER_symbolType) type;
    value->type.parameter_class = (MOJOSHADER_symbolClass) valclass;
    value->name = readstring(base, name, m, d);
    value->semantic = readstring(base, semantic, m, d);
    value->type.elements = numelements;

    /* Class sanity check */
    assert(valclass >= MOJOSHADER_SYMCLASS_SCALAR && valclass <= MOJOSHADER_SYMCLASS_STRUCT);

    if (valclass == MOJOSHADER_SYMCLASS_SCALAR
     || valclass == MOJOSHADER_SYMCLASS_VECTOR
     || valclass == MOJOSHADER_SYMCLASS_MATRIX_ROWS
     || valclass == MOJOSHADER_SYMCLASS_MATRIX_COLUMNS)
    {
        /* These classes only ever contain scalar values */
        assert(type >= MOJOSHADER_SYMTYPE_BOOL && type <= MOJOSHADER_SYMTYPE_FLOAT);

        const uint32 columncount = readui32(&typeptr, &typelen);
        const uint32 rowcount = readui32(&typeptr, &typelen);

        value->type.columns = columncount;
        value->type.rows = rowcount;

        uint32 siz = 4 * rowcount;
        if (numelements > 0)
            siz *= numelements;
        value->value_count = siz;
        siz *= 4;
        value->values = m(siz, d);
        memset(value->values, '\0', siz);
        siz /= 16;
        for (i = 0; i < siz; i++)
            memcpy(value->valuesF + (i << 2), valptr + ((columncount << 2) * i), columncount << 2);
    } // if
    else if (valclass == MOJOSHADER_SYMCLASS_OBJECT)
    {
        /* This class contains either samplers or "objects" */
        assert(type >= MOJOSHADER_SYMTYPE_STRING && type <= MOJOSHADER_SYMTYPE_VERTEXSHADER);

        if (type == MOJOSHADER_SYMTYPE_SAMPLER
         || type == MOJOSHADER_SYMTYPE_SAMPLER1D
         || type == MOJOSHADER_SYMTYPE_SAMPLER2D
         || type == MOJOSHADER_SYMTYPE_SAMPLER3D
         || type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            unsigned int vallen = 9999999; // !!! FIXME
            const uint32 numstates = readui32(&valptr, &vallen);

            value->value_count = numstates;

            const uint32 siz = sizeof(MOJOSHADER_effectSamplerState) * numstates;
            value->values = m(siz, d);
            memset(value->values, '\0', siz);

            for (i = 0; i < numstates; i++)
            {
                MOJOSHADER_effectSamplerState *state = &value->valuesSS[i];
                const uint32 stype = readui32(&valptr, &vallen) & ~0xA0;
                /*const uint32 FIXME =*/ readui32(&valptr, &vallen);
                const uint32 statetypeoffset = readui32(&valptr, &vallen);
                const uint32 statevaloffset = readui32(&valptr, &vallen);

                state->type = (MOJOSHADER_samplerStateType) stype;
                readvalue(base, statetypeoffset, statevaloffset,
                          &state->value, objects,
                          m, d);
                if (stype == MOJOSHADER_SAMP_TEXTURE)
                    objects[state->value.valuesI[0]].type = (MOJOSHADER_symbolType) type;
            } // for
        } // if
        else
        {
            uint32 numobjects = 1;
            if (numelements > 0)
                numobjects = numelements;

            value->value_count = numobjects;

            const uint32 siz = 4 * numobjects;
            value->values = m(siz, d);
            memcpy(value->values, valptr, siz);

            for (i = 0; i < value->value_count; i++)
                objects[value->valuesI[i]].type = (MOJOSHADER_symbolType) type;
        } // else
    } // else if
    else if (valclass == MOJOSHADER_SYMCLASS_STRUCT)
    {
        uint32 siz;

        value->type.member_count = readui32(&typeptr, &typelen);
        siz = value->type.member_count * sizeof (MOJOSHADER_symbolStructMember);
        value->type.members = (MOJOSHADER_symbolStructMember *) m(siz, d);

        uint32 structsize = 0;
        for (i = 0; i < value->type.member_count; i++)
        {
            MOJOSHADER_symbolStructMember *mem = &value->type.members[i];

            mem->info.parameter_type = (MOJOSHADER_symbolType) readui32(&typeptr, &typelen);
            mem->info.parameter_class = (MOJOSHADER_symbolClass) readui32(&typeptr, &typelen);

            const uint32 memname = readui32(&typeptr, &typelen);
            /*const uint32 memsemantic =*/ readui32(&typeptr, &typelen);
            mem->name = readstring(base, memname, m, d);

            mem->info.elements = readui32(&typeptr, &typelen);
            mem->info.columns = readui32(&typeptr, &typelen);
            mem->info.rows = readui32(&typeptr, &typelen);

            // !!! FIXME: Nested structs! -flibit
            assert(mem->info.parameter_class >= MOJOSHADER_SYMCLASS_SCALAR
                && mem->info.parameter_class <= MOJOSHADER_SYMCLASS_VECTOR);
            assert(mem->info.parameter_type >= MOJOSHADER_SYMTYPE_BOOL
                && mem->info.parameter_type <= MOJOSHADER_SYMTYPE_FLOAT);
            mem->info.member_count = 0;
            mem->info.members = NULL;

            uint32 memsize = 4 * mem->info.rows;
            if (mem->info.elements > 0)
                memsize *= mem->info.elements;
            structsize += memsize;
        } // for

        value->type.columns = structsize;
        value->type.rows = 1;
        value->value_count = structsize;
        if (numelements > 0)
            value->value_count *= numelements;

        siz = value->value_count * 4;
        value->values = m(siz, d);
        memset(value->values, '\0', siz);
        int dst_offset = 0, src_offset = 0;
        i = 0;
        do
        {
            for (j = 0; j < value->type.member_count; j++)
            {
                siz = value->type.members[j].info.rows * value->type.members[j].info.elements;
                for (k = 0; k < siz; k++)
                {
                    memcpy(value->valuesF + dst_offset,
                           typeptr + src_offset, /* Yes, typeptr. -flibit */
                           value->type.members[j].info.columns << 2);
                    dst_offset += 4;
                    src_offset += value->type.members[j].info.columns << 2;
                } // for
            }
        } while (++i < numelements);
    } // else if
}